

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O3

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
avro::parsing::ResolvingGrammarGenerator::fields_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,ResolvingGrammarGenerator *this,NodePtr *n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (**(code **)(*(this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator +
                      0x38))();
  if (uVar3 != 0) {
    paVar1 = &local_58.first.field_2;
    uVar5 = 0;
    do {
      pp_Var2 = (this->super_ValidatingGrammarGenerator)._vptr_ValidatingGrammarGenerator;
      plVar4 = (long *)(**(code **)(*pp_Var2 + 0x40))(pp_Var2,uVar5 & 0xffffffff);
      local_58.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,*plVar4,plVar4[1] + *plVar4);
      local_58.second = uVar5;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_long>>
                ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
                  *)__return_storage_ptr__,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<pair<string, size_t> > fields(const NodePtr& n) {
        vector<pair<string, size_t> > result;
        size_t c = n->names();
        for (size_t i = 0; i < c; ++i) {
            result.push_back(make_pair(n->nameAt(i), i));
        }
        return result;
    }